

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void hashkey(connectdata *conn,char *buf,size_t len)

{
  char *local_28;
  char *hostname;
  size_t len_local;
  char *buf_local;
  connectdata *conn_local;
  
  if ((*(uint *)&(conn->bits).field_0x4 >> 6 & 1) == 0) {
    if ((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) == 0) {
      if ((*(uint *)&(conn->bits).field_0x4 >> 2 & 1) == 0) {
        local_28 = (conn->host).name;
      }
      else {
        local_28 = (conn->conn_to_host).name;
      }
    }
    else {
      local_28 = (conn->http_proxy).host.name;
    }
  }
  else {
    local_28 = (conn->socks_proxy).host.name;
  }
  curl_msnprintf(buf,len,"%ld%s",conn->port,local_28);
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf,
                    size_t len) /* something like 128 is fine */
{
  const char *hostname;

  if(conn->bits.socksproxy)
    hostname = conn->socks_proxy.host.name;
  else if(conn->bits.httpproxy)
    hostname = conn->http_proxy.host.name;
  else if(conn->bits.conn_to_host)
    hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  DEBUGASSERT(len > 32);

  /* put the number first so that the hostname gets cut off if too long */
  msnprintf(buf, len, "%ld%s", conn->port, hostname);
}